

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O2

CURLcode Curl_getformdata(SessionHandle *data,FormData **finalform,curl_httppost *post,
                         char *custom_content_type,curl_off_t *sizep)

{
  curl_slist *pcVar1;
  ulong uVar2;
  formtype type;
  CURLcode CVar3;
  int iVar4;
  char *pcVar5;
  FILE *__stream;
  size_t length;
  char *pcVar6;
  curl_slist **ppcVar7;
  curl_httppost *file;
  curl_httppost *pcVar8;
  char *local_278;
  curl_off_t size;
  FormData *form;
  FormData **local_258;
  SessionHandle *local_250;
  FormData *firstform;
  curl_off_t *local_240;
  char buffer [512];
  
  form = (FormData *)0x0;
  size = 0;
  *finalform = (FormData *)0x0;
  if (post != (curl_httppost *)0x0) {
    pcVar5 = formboundary(data);
    if (pcVar5 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar6 = "Content-Type: multipart/form-data";
    if (custom_content_type != (char *)0x0) {
      pcVar6 = custom_content_type;
    }
    local_250 = data;
    CVar3 = AddFormDataf(&form,(curl_off_t *)0x0,"%s; boundary=%s\r\n",pcVar6,pcVar5);
    if (CVar3 != CURLE_OK) {
      (*Curl_cfree)(pcVar5);
      return CVar3;
    }
    firstform = form;
    local_278 = (char *)0x0;
    local_258 = finalform;
    local_240 = sizep;
    do {
      if (((((size != 0) && (CVar3 = AddFormDataf(&form,&size,"\r\n"), CVar3 != CURLE_OK)) ||
           (CVar3 = AddFormDataf(&form,&size,"--%s\r\n",pcVar5), CVar3 != CURLE_OK)) ||
          ((CVar3 = AddFormDataf(&form,&size,"Content-Disposition: form-data; name=\""),
           CVar3 != CURLE_OK ||
           (CVar3 = AddFormData(&form,FORM_DATA,post->name,post->namelength,&size),
           CVar3 != CURLE_OK)))) || (CVar3 = AddFormDataf(&form,&size,"\""), CVar3 != CURLE_OK))
      goto LAB_0048175b;
      pcVar8 = post;
      if (post->more != (curl_httppost *)0x0) {
        if (local_278 != (char *)0x0) {
          (*Curl_cfree)(local_278);
        }
        local_278 = formboundary(local_250);
        if (local_278 == (char *)0x0) {
          local_278 = (char *)0x0;
          CVar3 = CURLE_OUT_OF_MEMORY;
          goto LAB_0048175b;
        }
        CVar3 = AddFormDataf(&form,&size,"\r\nContent-Type: multipart/mixed; boundary=%s\r\n",
                             local_278);
        if (CVar3 != CURLE_OK) goto LAB_0048175b;
      }
      do {
        if (post->more == (curl_httppost *)0x0) {
          if (((post->flags & 0x51U) != 0) &&
             ((file = post, (post->flags & 1U) != 0 || (post->showfilename != (char *)0x0))))
          goto LAB_004814cf;
        }
        else {
          CVar3 = AddFormDataf(&form,&size,"\r\n--%s\r\nContent-Disposition: attachment",local_278);
          file = pcVar8;
          if (CVar3 != CURLE_OK) goto LAB_0048175b;
LAB_004814cf:
          CVar3 = formdata_add_filename(file,&form,&size);
          if (CVar3 != CURLE_OK) goto LAB_0048175b;
        }
        if ((pcVar8->contenttype != (char *)0x0) &&
           (CVar3 = AddFormDataf(&form,&size,"\r\nContent-Type: %s"), CVar3 != CURLE_OK))
        goto LAB_0048175b;
        ppcVar7 = &pcVar8->contentheader;
        while (pcVar1 = *ppcVar7, pcVar1 != (curl_slist *)0x0) {
          CVar3 = AddFormDataf(&form,&size,"\r\n%s");
          ppcVar7 = &pcVar1->next;
          if (CVar3 != CURLE_OK) goto LAB_0048175b;
        }
        CVar3 = AddFormDataf(&form,&size,"\r\n\r\n");
        if (CVar3 != CURLE_OK) goto LAB_0048175b;
        uVar2 = post->flags;
        if ((uVar2 & 3) == 0) {
          if ((uVar2 & 0x10) == 0) {
            if ((uVar2 & 0x40) == 0) {
              pcVar6 = post->contents;
              type = FORM_CONTENT;
            }
            else {
              pcVar6 = (char *)post->userp;
              type = FORM_CALLBACK;
            }
            CVar3 = AddFormData(&form,type,pcVar6,post->contentslength,&size);
          }
          else {
            CVar3 = AddFormData(&form,FORM_CONTENT,post->buffer,post->bufferlength,&size);
          }
        }
        else {
          iVar4 = curl_strequal("-",pcVar8->contents);
          __stream = _stdin;
          if (iVar4 == 0) {
            __stream = fopen64(pcVar8->contents,"rb");
          }
          if (__stream == (FILE *)0x0) {
            if (local_250 != (SessionHandle *)0x0) {
              Curl_failf(local_250,"couldn\'t open file \"%s\"",pcVar8->contents);
            }
            *local_258 = (FormData *)0x0;
            CVar3 = CURLE_READ_ERROR;
          }
          else if (__stream == _stdin) {
            do {
              length = fread(buffer,1,0x200,__stream);
              if (length == 0) {
                CVar3 = CURLE_OK;
                break;
              }
              CVar3 = AddFormData(&form,FORM_CONTENT,buffer,length,&size);
            } while (CVar3 == CURLE_OK);
          }
          else {
            fclose(__stream);
            CVar3 = AddFormData(&form,FORM_FILE,pcVar8->contents,0,&size);
          }
        }
      } while ((pcVar8->more != (curl_httppost *)0x0) && (pcVar8 = pcVar8->more, CVar3 == CURLE_OK))
      ;
      if ((CVar3 != CURLE_OK) ||
         ((post->more != (curl_httppost *)0x0 &&
          (CVar3 = AddFormDataf(&form,&size,"\r\n--%s--",local_278), CVar3 != CURLE_OK))))
      goto LAB_0048175b;
      post = post->next;
    } while (post != (curl_httppost *)0x0);
    CVar3 = AddFormDataf(&form,&size,"\r\n--%s--\r\n",pcVar5);
    if (CVar3 != CURLE_OK) {
LAB_0048175b:
      Curl_formclean(&firstform);
      if (local_278 != (char *)0x0) {
        (*Curl_cfree)(local_278);
      }
      (*Curl_cfree)(pcVar5);
      return CVar3;
    }
    *local_240 = size;
    if (local_278 != (char *)0x0) {
      (*Curl_cfree)(local_278);
    }
    (*Curl_cfree)(pcVar5);
    *local_258 = firstform;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_getformdata(struct SessionHandle *data,
                          struct FormData **finalform,
                          struct curl_httppost *post,
                          const char *custom_content_type,
                          curl_off_t *sizep)
{
  struct FormData *form = NULL;
  struct FormData *firstform;
  struct curl_httppost *file;
  CURLcode result = CURLE_OK;

  curl_off_t size = 0; /* support potentially ENORMOUS formposts */
  char *boundary;
  char *fileboundary = NULL;
  struct curl_slist* curList;

  *finalform = NULL; /* default form is empty */

  if(!post)
    return result; /* no input => no output! */

  boundary = formboundary(data);
  if(!boundary)
    return CURLE_OUT_OF_MEMORY;

  /* Make the first line of the output */
  result = AddFormDataf(&form, NULL,
                        "%s; boundary=%s\r\n",
                        custom_content_type?custom_content_type:
                        "Content-Type: multipart/form-data",
                        boundary);

  if(result) {
    Curl_safefree(boundary);
    return result;
  }
  /* we DO NOT include that line in the total size of the POST, since it'll be
     part of the header! */

  firstform = form;

  do {

    if(size) {
      result = AddFormDataf(&form, &size, "\r\n");
      if(result)
        break;
    }

    /* boundary */
    result = AddFormDataf(&form, &size, "--%s\r\n", boundary);
    if(result)
      break;

    /* Maybe later this should be disabled when a custom_content_type is
       passed, since Content-Disposition is not meaningful for all multipart
       types.
    */
    result = AddFormDataf(&form, &size,
                          "Content-Disposition: form-data; name=\"");
    if(result)
      break;

    result = AddFormData(&form, FORM_DATA, post->name, post->namelength,
                         &size);
    if(result)
      break;

    result = AddFormDataf(&form, &size, "\"");
    if(result)
      break;

    if(post->more) {
      /* If used, this is a link to more file names, we must then do
         the magic to include several files with the same field name */

      Curl_safefree(fileboundary);
      fileboundary = formboundary(data);
      if(!fileboundary) {
        result = CURLE_OUT_OF_MEMORY;
        break;
      }

      result = AddFormDataf(&form, &size,
                            "\r\nContent-Type: multipart/mixed;"
                            " boundary=%s\r\n",
                            fileboundary);
      if(result)
        break;
    }

    file = post;

    do {

      /* If 'showfilename' is set, that is a faked name passed on to us
         to use to in the formpost. If that is not set, the actually used
         local file name should be added. */

      if(post->more) {
        /* if multiple-file */
        result = AddFormDataf(&form, &size,
                              "\r\n--%s\r\nContent-Disposition: "
                              "attachment",
                              fileboundary);
        if(result)
          break;
        result = formdata_add_filename(file, &form, &size);
        if(result)
          break;
      }
      else if(post->flags & (HTTPPOST_FILENAME|HTTPPOST_BUFFER|
                             HTTPPOST_CALLBACK)) {
        /* it should be noted that for the HTTPPOST_FILENAME and
           HTTPPOST_CALLBACK cases the ->showfilename struct member is always
           assigned at this point */
        if(post->showfilename || (post->flags & HTTPPOST_FILENAME)) {
          result = formdata_add_filename(post, &form, &size);
        }

        if(result)
          break;
      }

      if(file->contenttype) {
        /* we have a specified type */
        result = AddFormDataf(&form, &size,
                              "\r\nContent-Type: %s",
                              file->contenttype);
        if(result)
          break;
      }

      curList = file->contentheader;
      while(curList) {
        /* Process the additional headers specified for this form */
        result = AddFormDataf( &form, &size, "\r\n%s", curList->data );
        if(result)
          break;
        curList = curList->next;
      }
      if(result)
        break;

      result = AddFormDataf(&form, &size, "\r\n\r\n");
      if(result)
        break;

      if((post->flags & HTTPPOST_FILENAME) ||
         (post->flags & HTTPPOST_READFILE)) {
        /* we should include the contents from the specified file */
        FILE *fileread;

        fileread = strequal("-", file->contents)?
          stdin:fopen(file->contents, "rb"); /* binary read for win32  */

        /*
         * VMS: This only allows for stream files on VMS.  Stream files are
         * OK, as are FIXED & VAR files WITHOUT implied CC For implied CC,
         * every record needs to have a \n appended & 1 added to SIZE
         */

        if(fileread) {
          if(fileread != stdin) {
            /* close the file */
            fclose(fileread);
            /* add the file name only - for later reading from this */
            result = AddFormData(&form, FORM_FILE, file->contents, 0, &size);
          }
          else {
            /* When uploading from stdin, we can't know the size of the file,
             * thus must read the full file as before. We *could* use chunked
             * transfer-encoding, but that only works for HTTP 1.1 and we
             * can't be sure we work with such a server.
             */
            size_t nread;
            char buffer[512];
            while((nread = fread(buffer, 1, sizeof(buffer), fileread)) != 0) {
              result = AddFormData(&form, FORM_CONTENT, buffer, nread, &size);
              if(result)
                break;
            }
          }
        }
        else {
          if(data)
            failf(data, "couldn't open file \"%s\"", file->contents);
          *finalform = NULL;
          result = CURLE_READ_ERROR;
        }
      }
      else if(post->flags & HTTPPOST_BUFFER)
        /* include contents of buffer */
        result = AddFormData(&form, FORM_CONTENT, post->buffer,
                             post->bufferlength, &size);
      else if(post->flags & HTTPPOST_CALLBACK)
        /* the contents should be read with the callback and the size
           is set with the contentslength */
        result = AddFormData(&form, FORM_CALLBACK, post->userp,
                             post->contentslength, &size);
      else
        /* include the contents we got */
        result = AddFormData(&form, FORM_CONTENT, post->contents,
                             post->contentslength, &size);

      file = file->more;
    } while(file && !result); /* for each specified file for this field */

    if(result)
      break;

    if(post->more) {
      /* this was a multiple-file inclusion, make a termination file
         boundary: */
      result = AddFormDataf(&form, &size,
                           "\r\n--%s--",
                           fileboundary);
      if(result)
        break;
    }

  } while((post = post->next) != NULL); /* for each field */

  /* end-boundary for everything */
  if(CURLE_OK == result)
    result = AddFormDataf(&form, &size,
                          "\r\n--%s--\r\n",
                          boundary);

  if(result) {
    Curl_formclean(&firstform);
    Curl_safefree(fileboundary);
    Curl_safefree(boundary);
    return result;
  }

  *sizep = size;

  Curl_safefree(fileboundary);
  Curl_safefree(boundary);

  *finalform = firstform;

  return result;
}